

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Parser * __thiscall minja::Parser::unterminated(Parser *this,TemplateToken *token)

{
  long in_RDX;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  TemplateToken::typeToString_abi_cxx11_
            (&local_40,(TemplateToken *)(ulong)*(uint *)(in_RDX + 8),(Type)in_RDX);
  std::operator+(&local_80,"Unterminated ",&local_40);
  error_location_suffix(&local_a0,(string *)token->_vptr_TemplateToken,*(size_t *)(in_RDX + 0x20));
  std::operator+(&local_60,&local_80,&local_a0);
  std::runtime_error::runtime_error((runtime_error *)this,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return this;
}

Assistant:

std::runtime_error unterminated(const TemplateToken & token) const {
      return std::runtime_error("Unterminated " + TemplateToken::typeToString(token.type)
        + error_location_suffix(*template_str, token.location.pos));
    }